

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImBezierCubicClosestPoint
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  float fVar1;
  ImVec2 local_6c;
  float local_64;
  ImVec2 IStack_60;
  float dist2;
  ImVec2 p_line;
  ImVec2 p_current;
  int i_step;
  float t_step;
  float p_closest_dist2;
  ImVec2 p_last;
  int num_segments_local;
  ImVec2 *p_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImVec2 *p1_local;
  ImVec2 p_closest;
  
  p_last.x = (float)num_segments;
  unique0x100000e2 = p;
  if (0 < num_segments) {
    _t_step = *p1;
    ImVec2::ImVec2((ImVec2 *)&p1_local);
    i_step = 0x7f7fffff;
    fVar1 = (float)(int)p_last.x;
    for (p_current.x = 1.4013e-45; (int)p_current.x <= (int)p_last.x;
        p_current.x = (float)((int)p_current.x + 1)) {
      p_line = ImBezierCubicCalc(p1,p2,p3,p4,(1.0 / fVar1) * (float)(int)p_current.x);
      IStack_60 = ImLineClosestPoint((ImVec2 *)&t_step,&p_line,stack0xffffffffffffffc8);
      local_6c = operator-(stack0xffffffffffffffc8,&stack0xffffffffffffffa0);
      local_64 = ImLengthSqr(&local_6c);
      if (local_64 < (float)i_step) {
        p1_local = (ImVec2 *)IStack_60;
        i_step = (int)local_64;
      }
      _t_step = p_line;
    }
    return (ImVec2)p1_local;
  }
  __assert_fail("num_segments > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0x46d,
                "ImVec2 ImBezierCubicClosestPoint(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, int)"
               );
}

Assistant:

ImVec2 ImBezierCubicClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}